

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

ASN1_STRING * ASN1_STRING_type_new(int type)

{
  ASN1_STRING *ret;
  ASN1_STRING *pAStack_10;
  int type_local;
  
  pAStack_10 = (ASN1_STRING *)OPENSSL_malloc(0x18);
  if (pAStack_10 == (ASN1_STRING *)0x0) {
    pAStack_10 = (ASN1_STRING *)0x0;
  }
  else {
    pAStack_10->length = 0;
    pAStack_10->type = type;
    pAStack_10->data = (uchar *)0x0;
    pAStack_10->flags = 0;
  }
  return pAStack_10;
}

Assistant:

ASN1_STRING *ASN1_STRING_type_new(int type) {
  ASN1_STRING *ret;

  ret = (ASN1_STRING *)OPENSSL_malloc(sizeof(ASN1_STRING));
  if (ret == NULL) {
    return NULL;
  }
  ret->length = 0;
  ret->type = type;
  ret->data = NULL;
  ret->flags = 0;
  return ret;
}